

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall slang::driver::Driver::reportMacros(Driver *this)

{
  DefineDirectiveSyntax *pDVar1;
  string_view text;
  pointer pSVar2;
  reference this_00;
  pointer ppDVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  Token TVar4;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar5;
  string_view fmt;
  string_view text_00;
  format_args args;
  size_t sVar6;
  char *pcVar7;
  SyntaxPrinter local_4c0;
  BumpAllocator alloc;
  _Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  local_480;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  string local_440;
  undefined8 local_420;
  undefined8 uStack_418;
  Diagnostics diagnostics;
  Preprocessor preprocessor;
  
  BumpAllocator::BumpAllocator(&alloc);
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  data_ = (pointer)diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                   super_SmallVectorBase<slang::Diagnostic>.firstElement;
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len
       = 0;
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap
       = 2;
  createOptionBag((Bag *)&local_4c0,this);
  local_468 = 0;
  uStack_460 = 0;
  sVar6 = 0;
  pcVar7 = (char *)0x0;
  parsing::Preprocessor::Preprocessor
            (&preprocessor,&this->sourceManager,&alloc,&diagnostics,(Bag *)&local_4c0,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  ska::detailv3::
  sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
  ::~sherwood_v3_table
            ((sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
              *)&local_4c0);
  for (pSVar2 = (this->buffers).
                super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar2 != (this->buffers).
                super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar2 = pSVar2 + -1) {
    sVar6 = pSVar2[-1].data._M_len;
    pcVar7 = pSVar2[-1].data._M_str;
    parsing::Preprocessor::pushSource(&preprocessor,pSVar2[-1]);
  }
  do {
    TVar4 = parsing::Preprocessor::next(&preprocessor);
  } while (TVar4.kind != EndOfFile);
  parsing::Preprocessor::getDefinedMacros
            ((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              *)&local_480,&preprocessor);
  for (ppDVar3 = local_480._M_impl.super__Vector_impl_data._M_start;
      ppDVar3 != local_480._M_impl.super__Vector_impl_data._M_finish; ppDVar3 = ppDVar3 + 1) {
    pDVar1 = *ppDVar3;
    local_4c0.buffer._M_dataplus._M_p = (pointer)&local_4c0.buffer.field_2;
    local_4c0.buffer._M_string_length = 0;
    local_4c0.buffer.field_2._M_local_buf[0] = '\0';
    local_4c0.sourceManager = (SourceManager *)0x0;
    local_4c0.includePreprocessed = true;
    local_4c0.includeComments = false;
    local_4c0.squashNewlines = true;
    local_4c0.includeTrivia = false;
    local_4c0.includeMissing = false;
    local_4c0.includeSkipped = false;
    local_4c0.includeDirectives = false;
    TVar4.kind = (pDVar1->name).kind;
    TVar4._2_1_ = (pDVar1->name).field_0x2;
    TVar4.numFlags.raw = (pDVar1->name).numFlags.raw;
    TVar4.rawLen = (pDVar1->name).rawLen;
    TVar4.info = (pDVar1->name).info;
    slang::syntax::SyntaxPrinter::print(&local_4c0,TVar4);
    local_4c0.includeTrivia = true;
    if (pDVar1->formalArguments != (MacroFormalArgumentListSyntax *)0x0) {
      slang::syntax::SyntaxPrinter::print(&local_4c0,&pDVar1->formalArguments->super_SyntaxNode);
    }
    if ((pDVar1->body).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ != 0) {
      this_00 = nonstd::span_lite::span<slang::parsing::Token,_18446744073709551615UL>::operator[]
                          (&(pDVar1->body).super_span<slang::parsing::Token,_18446744073709551615UL>
                           ,0);
      sVar5 = parsing::Token::trivia(this_00);
      if (sVar5.size_ == 0) {
        text_00._M_str = " ";
        text_00._M_len = 1;
        slang::syntax::SyntaxPrinter::append(&local_4c0,text_00);
      }
    }
    slang::syntax::SyntaxPrinter::print
              (&local_4c0,&(pDVar1->body).super_SyntaxListBase.super_SyntaxNode);
    std::__cxx11::string::string((string *)&local_420,(string *)&local_4c0);
    local_458 = local_420;
    uStack_450 = uStack_418;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x3;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_458;
    ::fmt::v9::vformat_abi_cxx11_(&local_440,(v9 *)0x33e25a,fmt,args);
    text._M_str = pcVar7;
    text._M_len = sVar6;
    OS::print(text);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_4c0);
  }
  std::
  _Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ::~_Vector_base(&local_480);
  parsing::Preprocessor::~Preprocessor(&preprocessor);
  SmallVectorBase<slang::Diagnostic>::~SmallVectorBase
            ((SmallVectorBase<slang::Diagnostic> *)&diagnostics);
  BumpAllocator::~BumpAllocator(&alloc);
  return;
}

Assistant:

void Driver::reportMacros() {
    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, createOptionBag());

    for (auto it = buffers.rbegin(); it != buffers.rend(); it++)
        preprocessor.pushSource(*it);

    while (true) {
        Token token = preprocessor.next();
        if (token.kind == TokenKind::EndOfFile)
            break;
    }

    for (auto macro : preprocessor.getDefinedMacros()) {
        SyntaxPrinter printer;
        printer.setIncludeComments(false);
        printer.setIncludeTrivia(false);
        printer.print(macro->name);

        printer.setIncludeTrivia(true);
        if (macro->formalArguments)
            printer.print(*macro->formalArguments);

        if (!macro->body.empty() && macro->body[0].trivia().empty())
            printer.append(" "sv);

        printer.print(macro->body);

        OS::print(fmt::format("{}\n", printer.str()));
    }
}